

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableUpdateDrawChannels(ImGuiTable *table)

{
  ImS8 IVar1;
  char cVar2;
  long in_RDI;
  bool bVar3;
  ImGuiTableColumn *column;
  int column_n;
  int draw_channel_current;
  int channels_total;
  int channels_for_dummy;
  int channels_for_background;
  int channels_for_row;
  int freeze_row_multiplier;
  int local_44;
  int iVar4;
  int i;
  ImGuiTableColumn *in_stack_ffffffffffffffd0;
  int local_24;
  
  cVar2 = '\x01';
  if ('\0' < *(char *)(in_RDI + 0x1ce)) {
    cVar2 = '\x02';
  }
  if ((*(uint *)(in_RDI + 4) & 0x4000) == 0) {
    iVar4 = *(int *)(in_RDI + 0x70);
  }
  else {
    iVar4 = 1;
  }
  bVar3 = true;
  if (*(int *)(in_RDI + 0x6c) <= *(int *)(in_RDI + 0x70)) {
    bVar3 = *(long *)(in_RDI + 0x58) != *(long *)(in_RDI + 0x48);
  }
  cVar2 = (char)iVar4 * cVar2 + bVar3;
  i = iVar4;
  ImDrawListSplitter::Split(_channels_for_dummy,_draw_channel_current,column_n);
  if (bVar3 == false) {
    cVar2 = -1;
  }
  *(char *)(in_RDI + 0x1cc) = cVar2;
  cVar2 = '\x01';
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x6c); local_24 = local_24 + 1) {
    in_stack_ffffffffffffffd0 =
         ImSpan<ImGuiTableColumn>::operator[]
                   ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffd0,i);
    if ((in_stack_ffffffffffffffd0->IsClipped & 1U) == 0) {
      in_stack_ffffffffffffffd0->DrawChannelRowsBeforeFreeze = cVar2;
      local_44 = iVar4;
      if (*(char *)(in_RDI + 0x1ce) < '\x01') {
        local_44 = 0;
      }
      in_stack_ffffffffffffffd0->DrawChannelRowsAfterFreeze = cVar2 + (char)local_44;
      if ((*(uint *)(in_RDI + 4) & 0x4000) == 0) {
        cVar2 = cVar2 + '\x01';
      }
    }
    else {
      IVar1 = *(ImS8 *)(in_RDI + 0x1cc);
      in_stack_ffffffffffffffd0->DrawChannelRowsAfterFreeze = IVar1;
      in_stack_ffffffffffffffd0->DrawChannelRowsBeforeFreeze = IVar1;
    }
    in_stack_ffffffffffffffd0->DrawChannelCurrent =
         in_stack_ffffffffffffffd0->DrawChannelRowsBeforeFreeze;
  }
  return;
}

Assistant:

void ImGui::TableUpdateDrawChannels(ImGuiTable* table)
{
    // Allocate draw channels.
    // - We allocate them following storage order instead of display order so reordering columns won't needlessly
    //   increase overall dormant memory cost.
    // - We isolate headers draw commands in their own channels instead of just altering clip rects.
    //   This is in order to facilitate merging of draw commands.
    // - After crossing FreezeRowsCount, all columns see their current draw channel changed to a second set of channels.
    // - We only use the dummy draw channel so we can push a null clipping rectangle into it without affecting other
    //   channels, while simplifying per-row/per-cell overhead. It will be empty and discarded when merged.
    // Draw channel allocation (before merging):
    // - NoClip                       --> 1+1 channels: background + foreground (same clip rect == 1 draw call)
    // - Clip                         --> 1+N channels
    // - FreezeRows || FreezeColumns  --> 1+N*2 (unless scrolling value is zero)
    // - FreezeRows && FreezeColunns  --> 2+N*2 (unless scrolling value is zero)
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClipX) ? 1 : table->ColumnsVisibleCount;
    const int channels_for_background = 1;
    const int channels_for_dummy = (table->ColumnsVisibleCount < table->ColumnsCount || table->VisibleUnclippedMaskByIndex != table->VisibleMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_background + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = channels_for_dummy ? (ImS8)(channels_total - 1) : -1;

    int draw_channel_current = 1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsClipped)
        {
            column->DrawChannelRowsBeforeFreeze = (ImS8)(draw_channel_current);
            column->DrawChannelRowsAfterFreeze = (ImS8)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClipX))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelRowsBeforeFreeze = column->DrawChannelRowsAfterFreeze = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelRowsBeforeFreeze;
    }
}